

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::portmap_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,portmap_error_alert *this)

{
  size_type *psVar1;
  error_category *peVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"could not map port using ","")
  ;
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_78 = *plVar5;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar5;
    local_88 = (long *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_b8 = *puVar6;
    uStack_b0 = (undefined4)plVar3[3];
    uStack_ac = *(undefined4 *)((long)plVar3 + 0x1c);
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar6;
    local_c8 = (ulong *)*plVar3;
  }
  local_c0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  peVar2 = (this->error).cat_;
  (*peVar2->_vptr_error_category[4])(&local_68,peVar2,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_a8,&local_68);
  uVar7 = 0xf;
  if (local_c8 != &local_b8) {
    uVar7 = local_b8;
  }
  if (uVar7 < local_a8._M_string_length + local_c0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar8 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_c0 <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_0017e751;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
LAB_0017e751:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar8 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string portmap_error_alert::message() const
	{
		return std::string("could not map port using ")
			+ nat_type_str[static_cast<int>(map_transport)]
			+ ": " + convert_from_native(error.message());
	}